

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O1

void uv_loadavg(double *avg)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  char local_108 [8];
  char buf [128];
  undefined1 local_80 [8];
  sysinfo info;
  double *avg_local;
  
  info._104_8_ = avg;
  iVar1 = uv__slurp("/proc/loadavg",local_108,0x80);
  if (((iVar1 != 0) ||
      (iVar1 = sscanf(local_108,"%lf %lf %lf",info._104_8_,info._104_8_ + 8,info._104_8_ + 0x10),
      iVar1 != 3)) && (iVar1 = sysinfo((sysinfo *)local_80), -1 < iVar1)) {
    auVar2._8_4_ = (int)((ulong)info.uptime >> 0x20);
    auVar2._0_8_ = info.uptime;
    auVar2._12_4_ = 0x45300000;
    *(double *)info._104_8_ =
         ((auVar2._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)info.uptime) - 4503599627370496.0)) * 1.52587890625e-05;
    auVar3._8_4_ = (int)(info.loads[0] >> 0x20);
    auVar3._0_8_ = info.loads[0];
    auVar3._12_4_ = 0x45300000;
    *(double *)(info._104_8_ + 8) =
         ((auVar3._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)info.loads[0]) - 4503599627370496.0)) * 1.52587890625e-05
    ;
    auVar4._8_4_ = (int)(info.loads[1] >> 0x20);
    auVar4._0_8_ = info.loads[1];
    auVar4._12_4_ = 0x45300000;
    *(double *)(info._104_8_ + 0x10) =
         ((auVar4._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)info.loads[1]) - 4503599627370496.0)) / 65536.0;
  }
  return;
}

Assistant:

void uv_loadavg(double avg[3]) {
  struct sysinfo info;
  char buf[128];  /* Large enough to hold all of /proc/loadavg. */

  if (0 == uv__slurp("/proc/loadavg", buf, sizeof(buf)))
    if (3 == sscanf(buf, "%lf %lf %lf", &avg[0], &avg[1], &avg[2]))
      return;

  if (sysinfo(&info) < 0)
    return;

  avg[0] = (double) info.loads[0] / 65536.0;
  avg[1] = (double) info.loads[1] / 65536.0;
  avg[2] = (double) info.loads[2] / 65536.0;
}